

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O2

session * __thiscall helix::nasdaq::itch50_protocol::new_session(itch50_protocol *this,void *data)

{
  bool bVar1;
  binaryfile_session<helix::nasdaq::itch50_handler> *this_00;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==(&this->_name,"nasdaq-binaryfile-itch50");
  if (bVar1) {
    this_00 = (binaryfile_session<helix::nasdaq::itch50_handler> *)operator_new(0xd0);
    binaryfile_session<helix::nasdaq::itch50_handler>::binaryfile_session(this_00,data);
    return &this_00->super_session;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"unknown protocol: ",&this->_name);
  std::invalid_argument::invalid_argument(this_01,(string *)&local_40);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

session* itch50_protocol::new_session(void *data)
{
    if (_name == "nasdaq-binaryfile-itch50") {
        return new binaryfile_session<itch50_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}